

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O1

void __thiscall Firework::displayFireworkExplosion(Firework *this,Screen *screen)

{
  pointer *text;
  int iVar1;
  pointer pcVar2;
  size_type sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  pointer pbVar10;
  Screen *pSVar11;
  undefined8 uVar12;
  bool bVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Screen *local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_80.field_2._8_8_ = auStack_a8;
  auStack_a8 = (undefined1  [8])0x0;
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar21 = (ulong)(uint)this->explosionDiameter;
  local_48 = (double)CONCAT44(local_48._4_4_,this->explosionDiameter / 2);
  local_50 = (ulong)(uint)this->endPosition[0];
  local_58 = (ulong)(uint)this->endPosition[1];
  lVar7 = -(uVar21 * uVar21 + 0xf & 0xfffffffffffffff0);
  puVar17 = auStack_a8 + lVar7;
  sVar15 = (size_t)this->explosionDiameter;
  puVar18 = puVar17;
  uVar12 = auStack_a8;
  local_60 = screen;
  local_38 = (double)sVar15;
  if (0 < (long)sVar15) {
    do {
      local_80.field_2._8_8_ = uVar12;
      dVar4 = local_38;
      *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e5b5;
      memset(puVar18,0,(size_t)dVar4);
      sVar15 = sVar15 - 1;
      puVar18 = puVar18 + uVar21;
      uVar12 = local_80.field_2._8_8_;
    } while (sVar15 != 0);
  }
  iVar8 = local_48._0_4_;
  local_50 = (ulong)(uint)((int)local_50 - local_48._0_4_);
  local_40 = (double)((int)(((uint)((ulong)local_38 >> 0x1f) & 1) + SUB84(local_38,0)) >> 1);
  dVar4 = 0.0;
  do {
    local_48 = (double)(this->explosionDiameter / 2);
    local_38 = dVar4;
    *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e61a;
    dVar4 = cos(dVar4);
    dVar6 = local_38;
    dVar5 = dVar4 * local_48 + local_40;
    local_48 = (double)(this->explosionDiameter / 2);
    *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e64f;
    dVar6 = sin(dVar6);
    dVar4 = local_38;
    puVar17[(long)(int)dVar5 + (long)(int)(dVar6 * local_48 + local_40) * uVar21] = 1;
    dVar4 = dVar4 + 0.008726646259972222;
  } while (dVar4 <= 6.28318530718);
  iVar1 = this->explosionDiameter;
  uVar16 = (ulong)iVar1;
  if (0 < (long)uVar16) {
    uVar19 = 0;
    bVar9 = false;
    puVar18 = puVar17;
    do {
      uVar20 = 0;
      do {
        if ((((puVar18[uVar20] != 1) || (uVar19 == 0)) || (bVar9)) ||
           (bVar13 = true, uVar19 == iVar1 - 1)) {
          if ((puVar18[uVar20] & bVar9) == 0) {
            bVar13 = bVar9;
            if (bVar9 != false) {
              puVar18[uVar20] = 1;
            }
          }
          else {
            bVar13 = false;
          }
        }
        bVar9 = bVar13;
        uVar20 = uVar20 + 1;
      } while (uVar16 != uVar20);
      uVar19 = uVar19 + 1;
      puVar18 = puVar18 + uVar21;
    } while (uVar19 != uVar16);
  }
  pSVar11 = local_60;
  uVar14 = this->explosionColor;
  *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e70c;
  Screen::turnAttrOn(pSVar11,(uVar14 & 0xff) << 8);
  if (1.5 < this->explosionFrameCounter || this->explosionFrameCounter == 1.5) {
    this->fireworkStage = 4;
  }
  else {
    if (0 < this->explosionDiameter) {
      local_58 = (ulong)(uint)((int)local_58 - iVar8);
      local_40 = 0.0;
      text = &image.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_80.field_2._M_allocated_capacity = uVar21;
      do {
        if (0 < this->explosionDiameter) {
          local_38 = (double)CONCAT44(local_38._4_4_,(int)local_50 + SUB84(local_40,0));
          lVar22 = 0;
          do {
            if (puVar17[lVar22] == '\x01') {
              *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e77c;
              uVar14 = rand();
              if ((uVar14 & 1) != 0) {
                image.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_80;
                pcVar2 = (this->explosionParticle)._M_dataplus._M_p;
                sVar3 = (this->explosionParticle)._M_string_length;
                *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e7a4;
                std::__cxx11::string::_M_construct<char*>((string *)text,pcVar2,pcVar2 + sVar3);
                pSVar11 = local_60;
                iVar8 = (int)local_58;
                iVar1 = local_38._0_4_;
                *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e7bb;
                Screen::printString(pSVar11,(string *)text,iVar1,iVar8 + (int)lVar22);
                pbVar10 = image.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (image.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_80) {
                  *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e7d3;
                  operator_delete(pbVar10);
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < this->explosionDiameter);
        }
        local_40 = (double)((long)local_40 + 1);
        puVar17 = puVar17 + local_80.field_2._M_allocated_capacity;
      } while ((long)local_40 < (long)this->explosionDiameter);
    }
    this->explosionFrameCounter = this->explosionFrameCounter + 0.125;
  }
  pSVar11 = local_60;
  uVar14 = this->explosionColor;
  *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11e844;
  Screen::turnAttrOff(pSVar11,(uVar14 & 0xff) << 8);
  *(undefined8 *)(local_80.field_2._8_8_ + -8) = 0x11e854;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_a8);
  return;
}

Assistant:

void Firework::displayFireworkExplosion(Screen &screen) {
    double explosionCycleFrames = 3;      /* The number of frames to display the explosion circle                 */
    double explosionTotalTime = 1.5;         /* The total time, in seconds, to display the explosion circle          */

    std::vector<std::string> image;
    double i;
    int j, k;


    // Calculate the start coordinates for printing the 2d string array
    int startCursorPosition[2];
    startCursorPosition[0] = endPosition[0] - (explosionDiameter / 2);
    startCursorPosition[1] = endPosition[1] - (explosionDiameter / 2);

    // Generate the image boundaries
    bool boundaries[explosionDiameter][explosionDiameter];
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            boundaries[j][k] = false;
        }
    }

    int x, y;
    const int cx = explosionDiameter / 2;
    const int cy = explosionDiameter / 2;
    for(i = 0; i <= (2 * PI); i+= (PI / 360) ){
        // Calculate a point on the edge of the circle
        x = (int)( cx + (explosionDiameter / 2) * cos(i) );
        y = (int)( cy + (explosionDiameter / 2) * sin(i) );

        // Store that point in the boundary array
        boundaries[y][x] = true;
    }

    // Fill in the boundary circle

    bool flag = false;
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            if(boundaries[j][k] && !flag && j != 0 && j != (explosionDiameter - 1)){
                // Turn on the filling property
                flag = true;
            }
            else if(boundaries[j][k] && flag){
                // The other edge of the boundary circle has been reached
                flag = false;
            }
            else if(flag){
                boundaries[j][k] = true;
            }
        }
    }


    // Generate the image


    // Print the image
    screen.turnAttrOn(COLOR_PAIR(explosionColor));


    if(explosionFrameCounter < explosionTotalTime){
        for (j = 0; j < explosionDiameter; j++){
            for(k = 0; k < explosionDiameter; k++){
                if(boundaries[j][k]){
                    if(rand() % 2){
                        screen.printString(explosionParticle, startCursorPosition[0] + j, startCursorPosition[1] + k);
                    }
                }
            }
        }
        explosionFrameCounter += (explosionCycleFrames / FRAMES_PER_SECOND);
    }
    else{
        fireworkStage = FINISHED;
    }

    screen.turnAttrOff(COLOR_PAIR(explosionColor));
}